

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_vec.cpp
# Opt level: O1

vec_3d vector_add(vec_3d *a,vec_3d *b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec_3d vVar5;
  
  uVar1 = a->x;
  uVar3 = a->y;
  uVar2 = b->x;
  uVar4 = b->y;
  vVar5.x = (float)uVar2 + (float)uVar1;
  vVar5.y = (float)uVar4 + (float)uVar3;
  vVar5.z = a->z + b->z;
  return vVar5;
}

Assistant:

vec_3d operator+(const vec_3d &a, const vec_3d &b) {
    vec_3d result = {0.f};
#ifdef LIBQUAT_ARM
    arm_sub_f32((float *)&a, (float *)&b, (float *)&result);
#else
    result.x = a.x + b.x;
    result.y = a.y + b.y;
    result.z = a.z + b.z;
#endif

    return result;
}